

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCyclic.cpp
# Opt level: O2

void __thiscall SimpleCyclic::Cyclic::~Cyclic(Cyclic *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"N12SimpleCyclic6CyclicE");
  poVar1 = std::operator<<(poVar1,"::");
  poVar1 = std::operator<<(poVar1,"~Cyclic");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Function_base::~_Function_base(&(this->_fn).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<SimpleCyclic::Cyclic>)._M_weak_this.
              super___weak_ptr<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Cyclic::~Cyclic()
{
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}